

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_is_connected(Curl_easy *data,connectdata *conn,int sockindex,_Bool *connected)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  Curl_addrinfo *pCVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  int iVar12;
  _Bool _Var13;
  CURLcode CVar14;
  uint uVar15;
  CURLcode CVar16;
  timediff_t tVar17;
  int *piVar18;
  char *pcVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime cVar24;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  int error;
  CURLcode local_198;
  int local_194;
  curltime local_190;
  long local_180;
  _Bool *local_178;
  ulong local_170;
  char ipaddress [46];
  char buffer [256];
  
  error = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
    CVar14 = CURLE_OK;
  }
  else {
    cVar24 = Curl_now();
    local_190.tv_sec = cVar24.tv_sec;
    local_190.tv_usec = cVar24.tv_usec;
    if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
LAB_00127aa8:
      CVar14 = connect_SOCKS(data,sockindex,connected);
      if ((CVar14 == CURLE_OK) && (CVar14 = CURLE_OK, *connected == true)) {
        post_SOCKS(data,conn,sockindex,connected);
      }
    }
    else {
      local_198 = CURLE_OK;
      local_194 = sockindex;
      local_180 = (long)sockindex;
      local_178 = connected;
      for (lVar23 = 0; uVar22 = (uint)lVar23, lVar23 != 2; lVar23 = lVar23 + 1) {
        if (conn->tempsock[lVar23] != -1) {
          error = 0;
          uVar15 = Curl_socket_check(-1,-1,conn->tempsock[lVar23],0);
          uVar21 = (ulong)(uVar22 ^ 1);
          if (uVar15 == 2) {
LAB_00127bdd:
            _Var13 = verifyconnect(conn->tempsock[lVar23],&error);
            if (_Var13) {
              conn->sock[local_180] = conn->tempsock[lVar23];
              pCVar3 = conn->tempaddr[lVar23];
              conn->ip_addr = pCVar3;
              conn->tempsock[lVar23] = -1;
              *(uint *)&(conn->bits).field_0x4 =
                   *(uint *)&(conn->bits).field_0x4 & 0xffffefff |
                   (uint)(pCVar3->ai_family == 10) << 0xc;
              connected = local_178;
              sockindex = local_194;
              if (conn->tempsock[uVar21] != -1) {
                Curl_closesocket(data,conn,conn->tempsock[uVar21]);
                conn->tempsock[uVar21] = -1;
                connected = local_178;
                sockindex = local_194;
              }
              goto LAB_00127aa8;
            }
          }
          else if (uVar15 == 0) {
            cVar24.tv_usec = local_190.tv_usec;
            cVar24.tv_sec = local_190.tv_sec;
            uVar4 = (conn->connecttime).tv_sec;
            uVar5 = (conn->connecttime).tv_usec;
            older.tv_usec = uVar5;
            older.tv_sec = uVar4;
            cVar24._12_4_ = 0;
            older._12_4_ = 0;
            tVar17 = Curl_timediff(cVar24,older);
            if (conn->timeoutms_per_addr[lVar23] <= tVar17) {
              Curl_infof(data,"After %ldms connect time, move on!");
              error = 0x6e;
            }
            if (((lVar23 == 0) && (((conn->bits).field_0x7 & 0x40) == 0)) &&
               (newer.tv_usec = local_190.tv_usec, newer.tv_sec = local_190.tv_sec,
               uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
               older_00.tv_usec = uVar7, older_00.tv_sec = uVar6, newer._12_4_ = 0,
               older_00._12_4_ = 0, tVar17 = Curl_timediff(newer,older_00),
               (long)(ulong)(data->set).happy_eyeballs_timeout <= tVar17)) {
              puVar1 = &(conn->bits).field_0x7;
              *puVar1 = *puVar1 | 0x40;
              trynextip(data,conn,local_194,1);
            }
          }
          else {
            if (((conn->bits).field_0x7 & 2) != 0) goto LAB_00127bdd;
            if ((uVar15 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar23],&error);
            }
          }
          iVar12 = error;
          if (error != 0) {
            (data->state).os_errno = error;
            piVar18 = __errno_location();
            *piVar18 = iVar12;
            if (conn->tempaddr[lVar23] != (Curl_addrinfo *)0x0) {
              local_170 = uVar21;
              Curl_printable_address(conn->tempaddr[lVar23],ipaddress,0x2e);
              uVar15 = conn->port;
              pcVar19 = Curl_strerror(error,buffer,0x100);
              Curl_infof(data,"connect to %s port %u failed: %s",ipaddress,(ulong)uVar15,pcVar19);
              tVar17 = Curl_timeleft(data,&local_190,true);
              lVar20 = tVar17 / 2;
              if (conn->tempaddr[lVar23]->ai_next == (Curl_addrinfo *)0x0) {
                lVar20 = tVar17;
              }
              conn->timeoutms_per_addr[lVar23] = lVar20;
              ainext(conn,uVar22,true);
              CVar14 = trynextip(data,conn,local_194,uVar22);
              if (((CVar14 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_170] == -1)) &&
                 (local_198 == CURLE_OK)) {
                local_198 = CVar14;
              }
            }
          }
        }
      }
      tVar17 = Curl_timeleft(data,&local_190,true);
      if (tVar17 < 0) {
        newer_01.tv_usec = local_190.tv_usec;
        newer_01.tv_sec = local_190.tv_sec;
        uVar10 = (data->progress).t_startsingle.tv_sec;
        uVar11 = (data->progress).t_startsingle.tv_usec;
        older_02.tv_usec = uVar11;
        older_02.tv_sec = uVar10;
        newer_01._12_4_ = 0;
        older_02._12_4_ = 0;
        tVar17 = Curl_timediff(newer_01,older_02);
        Curl_failf(data,"Connection timeout after %ld ms",tVar17);
        CVar14 = CURLE_OPERATION_TIMEDOUT;
      }
      else {
        CVar14 = CURLE_OK;
        if (((local_198 != CURLE_OK) && (conn->tempsock[0] == -1)) &&
           ((conn->tempsock[1] == -1 &&
            (CVar16 = trynextip(data,conn,local_194,1), CVar16 != CURLE_OK)))) {
          uVar22 = *(uint *)&(conn->bits).field_0x4;
          lVar23 = 0xe8;
          if ((((uVar22 & 2) == 0) && (lVar23 = 0x128, (uVar22 & 1) == 0)) &&
             (lVar23 = 200, (uVar22 >> 9 & 1) == 0)) {
            lVar23 = 0x98;
          }
          uVar2 = *(undefined8 *)((conn->chunk).hexbuffer + lVar23 + -0x3d);
          uVar22 = conn->port;
          newer_00.tv_usec = local_190.tv_usec;
          newer_00.tv_sec = local_190.tv_sec;
          uVar8 = (data->progress).t_startsingle.tv_sec;
          uVar9 = (data->progress).t_startsingle.tv_usec;
          older_01.tv_usec = uVar9;
          older_01.tv_sec = uVar8;
          newer_00._12_4_ = 0;
          older_01._12_4_ = 0;
          tVar17 = Curl_timediff(newer_00,older_01);
          CVar16 = local_198;
          pcVar19 = curl_easy_strerror(local_198);
          Curl_failf(data,"Failed to connect to %s port %u after %ld ms: %s",uVar2,(ulong)uVar22,
                     tVar17,pcVar19);
          CVar14 = CURLE_OPERATION_TIMEDOUT;
          if ((data->state).os_errno != 0x6e) {
            CVar14 = CVar16;
          }
        }
      }
    }
  }
  return CVar14;
}

Assistant:

CURLcode Curl_is_connected(struct Curl_easy *data,
                           struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc = 0;
  unsigned int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(data, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(data, conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;
    error = 0;
#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(data, conn, i, connected);
      if(!result && *connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        post_SOCKS(data, conn, sockindex, connected);
        connkeep(conn, "HTTP/3 default");
        if(conn->tempsock[other] != CURL_SOCKET_BAD)
          Curl_quic_disconnect(data, conn, other);
        return CURLE_OK;
      }
      /* When a QUIC connect attempt fails, the better error explanation is in
         'result' and not in errno */
      if(result) {
        conn->tempsock[i] = CURL_SOCKET_BAD;
        error = SOCKERRNO;
      }
    }
    else
#endif
    {
#ifdef mpeix
      /* Call this function once now, and ignore the results. We do this to
         "clear" the error state on the socket so that we can later read it
         reliably. This is reported necessary on the MPE/iX operating
         system. */
      (void)verifyconnect(conn->tempsock[i], NULL);
#endif

      /* check socket for connect */
      rc = SOCKET_WRITABLE(conn->tempsock[i], 0);
    }

    if(rc == 0) { /* no connection yet */
      if(Curl_timediff(now, conn->connecttime) >=
         conn->timeoutms_per_addr[i]) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!", conn->timeoutms_per_addr[i]);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && !conn->bits.parallel_connect &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        conn->bits.parallel_connect = TRUE; /* starting now */
        trynextip(data, conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(data, conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(data, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(data, conn, sockindex, connected);

        return CURLE_OK;
      }
    }
    else if(rc & CURL_CSELECT_ERR) {
      (void)verifyconnect(conn->tempsock[i], &error);
    }

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress,
                               sizeof(ipaddress));
#ifdef ENABLE_QUIC
        if(conn->transport == TRNSPRT_QUIC) {
          infof(data, "connect to %s port %u failed: %s",
                ipaddress, conn->port, curl_easy_strerror(result));
        }
        else
#endif
        infof(data, "connect to %s port %u failed: %s",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));
#endif

        allow = Curl_timeleft(data, &now, TRUE);
        conn->timeoutms_per_addr[i] = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;
        ainext(conn, i, TRUE);
        status = trynextip(data, conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD) {
          /* the last attempt failed and no other sockets remain open */
          if(!result)
            result = status;
        }
      }
    }
  }

  /*
   * Now that we've checked whether we are connected, check whether we've
   * already timed out.
   *
   * First figure out how long time we have left to connect */

  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection timeout after %ld ms",
          Curl_timediff(now, data->progress.t_startsingle));
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result &&
     (conn->tempsock[0] == CURL_SOCKET_BAD) &&
     (conn->tempsock[1] == CURL_SOCKET_BAD)) {
    /* no more addresses to try */
    const char *hostname;
    CURLcode failreason = result;

    /* if the first address family runs out of addresses to try before the
       happy eyeball timeout, go ahead and try the next family now */
    result = trynextip(data, conn, sockindex, 1);
    if(!result)
      return result;

    result = failreason;

#ifndef CURL_DISABLE_PROXY
    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else
#endif
      if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %u after "
          "%" CURL_FORMAT_TIMEDIFF_T " ms: %s",
          hostname, conn->port,
          Curl_timediff(now, data->progress.t_startsingle),
          curl_easy_strerror(result));

    Curl_quic_disconnect(data, conn, 0);
    Curl_quic_disconnect(data, conn, 1);

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }
  else
    result = CURLE_OK; /* still trying */

  return result;
}